

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::completionCommon(QPDFArgParser *this,bool zsh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  element_type *peVar2;
  size_type __n;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  string path;
  string appdir;
  string progname;
  string appimage;
  string executable;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             *((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->argv,(allocator<char> *)&local_70);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             (((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->progname_env)._M_dataplus._M_p,(allocator<char> *)&local_50);
  bVar3 = QUtil::get_env(&local_f0,&local_70);
  paVar1 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"APPDIR","");
    bVar3 = QUtil::get_env(&local_f0,&local_d0);
    if (bVar3) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"APPIMAGE","");
      bVar3 = QUtil::get_env(&local_50,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    __n = local_d0._M_string_length;
    if (bVar3 == false) goto LAB_0015e67c;
    __s = *((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->argv;
    sVar5 = strlen(__s);
    if ((sVar5 <= __n) || (iVar4 = strncmp(local_d0._M_dataplus._M_p,__s,__n), iVar4 != 0))
    goto LAB_0015e67c;
  }
  std::__cxx11::string::_M_assign((string *)&local_b0);
LAB_0015e67c:
  if (zsh) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"autoload -U +X bashcompinit && bashcompinit && ",0x2f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"complete -o bashdefault -o default",0x22);
  if (!zsh) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -o nospace",0xb);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -C \"",5);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_b0,local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" ",2);
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(peVar2->whoami)._M_dataplus._M_p,(peVar2->whoami)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_b0,(long)local_b0 + local_a8);
  lVar7 = std::__cxx11::string::find((char)&local_f0,0x2f);
  if (lVar7 - 1U < 0xfffffffffffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
    peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(peVar2->whoami)._M_dataplus._M_p,
                        (peVar2->whoami)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," completion enabled",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," using relative path to executable",0x22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

void
QPDFArgParser::completionCommon(bool zsh)
{
    std::string progname = m->argv[0];
    std::string executable;
    std::string appdir;
    std::string appimage;
    if (QUtil::get_env(m->progname_env.c_str(), &executable)) {
        progname = executable;
    } else if (QUtil::get_env("APPDIR", &appdir) && QUtil::get_env("APPIMAGE", &appimage)) {
        // Detect if we're in an AppImage and adjust
        if ((appdir.length() < strlen(m->argv[0])) &&
            (strncmp(appdir.c_str(), m->argv[0], appdir.length()) == 0)) {
            progname = appimage;
        }
    }
    if (zsh) {
        std::cout << "autoload -U +X bashcompinit && bashcompinit && ";
    }
    std::cout << "complete -o bashdefault -o default";
    if (!zsh) {
        std::cout << " -o nospace";
    }
    std::cout << " -C \"" << progname << "\" " << m->whoami << std::endl;
    // Put output before error so calling from zsh works properly
    std::string path = progname;
    size_t slash = path.find('/');
    if ((slash != 0) && (slash != std::string::npos)) {
        std::cerr << "WARNING: " << m->whoami << " completion enabled"
                  << " using relative path to executable" << std::endl;
    }
}